

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_abs_sub_bit(__mpz_struct *d,mp_bitcnt_t bit_index)

{
  mp_srcptr xp;
  long n;
  ulong uVar1;
  mp_limb_t mVar2;
  mp_size_t mVar3;
  int local_50;
  int local_44;
  mp_limb_t __cy;
  mp_limb_t bit;
  mp_ptr dp;
  mp_size_t limb_index;
  mp_size_t dn;
  mp_bitcnt_t bit_index_local;
  __mpz_struct *d_local;
  
  if (d->_mp_size < 0) {
    local_44 = -d->_mp_size;
  }
  else {
    local_44 = d->_mp_size;
  }
  n = (long)local_44;
  xp = d->_mp_d;
  uVar1 = bit_index >> 6;
  if (n <= (long)uVar1) {
    __assert_fail("limb_index < dn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xdfe,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
  }
  mVar2 = mpn_sub_1(xp + uVar1,xp + uVar1,n - uVar1,1L << ((byte)bit_index & 0x3f));
  if (mVar2 != 0) {
    __assert_fail("__cy == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xe01,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
  }
  mVar3 = mpn_normalized_size(xp,n);
  local_50 = (int)mVar3;
  if (d->_mp_size < 0) {
    local_50 = -local_50;
  }
  d->_mp_size = local_50;
  return;
}

Assistant:

static void
mpz_abs_sub_bit (mpz_t d, mp_bitcnt_t bit_index)
{
  mp_size_t dn, limb_index;
  mp_ptr dp;
  mp_limb_t bit;

  dn = GMP_ABS (d->_mp_size);
  dp = d->_mp_d;

  limb_index = bit_index / GMP_LIMB_BITS;
  bit = (mp_limb_t) 1 << (bit_index % GMP_LIMB_BITS);

  assert (limb_index < dn);

  gmp_assert_nocarry (mpn_sub_1 (dp + limb_index, dp + limb_index,
				 dn - limb_index, bit));
  dn = mpn_normalized_size (dp, dn);
  d->_mp_size = (d->_mp_size < 0) ? - dn : dn;
}